

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Generators::Generators<int>::populate(Generators<int> *this,int *val)

{
  pointer *__ptr;
  GeneratorWrapper<int> local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<int>,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<int>_*,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<int>_*,_false>._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<int>,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<int>,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<int>_*,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<int>_*,_false>._M_head_impl =
       &PTR__GeneratorUntypedBase_00189070;
  *(int *)((long)local_18.m_generator._M_t.
                 super___uniq_ptr_impl<Catch::Generators::IGenerator<int>,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Catch::Generators::IGenerator<int>_*,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
                 .super__Head_base<0UL,_Catch::Generators::IGenerator<int>_*,_false>._M_head_impl +
          8) = *val;
  std::
  vector<Catch::Generators::GeneratorWrapper<int>,std::allocator<Catch::Generators::GeneratorWrapper<int>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<int>>
            ((vector<Catch::Generators::GeneratorWrapper<int>,std::allocator<Catch::Generators::GeneratorWrapper<int>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<int>,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<int>_*,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
      .super__Head_base<0UL,_Catch::Generators::IGenerator<int>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<int>,_std::default_delete<Catch::Generators::IGenerator<int>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<int>,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<int>_*,_std::default_delete<Catch::Generators::IGenerator<int>_>_>
                          .super__Head_base<0UL,_Catch::Generators::IGenerator<int>_*,_false>.
                          _M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }